

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_is_hdr_from_file(FILE *f)

{
  int iVar1;
  undefined1 local_e0 [8];
  stbi__context s;
  FILE *f_local;
  
  s.img_buffer_original = (stbi_uc *)f;
  stbi__start_file((stbi__context *)local_e0,f);
  iVar1 = stbi__hdr_test((stbi__context *)local_e0);
  return iVar1;
}

Assistant:

STBIDEF int      stbi_is_hdr_from_file(FILE *f)
{
   #ifndef STBI_NO_HDR
   stbi__context s;
   stbi__start_file(&s,f);
   return stbi__hdr_test(&s);
   #else
   return 0;
   #endif
}